

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamRandomAccessController::LocateIndex
          (BamRandomAccessController *this,BamReaderPrivate *reader,IndexType *preferredType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  string message;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  BamReaderPrivate::Filename_abi_cxx11_(&local_a0,reader);
  BamIndexFactory::FindIndexFilename(&local_40,&local_a0,preferredType);
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_40._M_string_length == 0) {
    paVar2 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"could not find index file for:","");
    BamReaderPrivate::Filename_abi_cxx11_(&local_60,reader);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0.field_2._8_8_ = plVar4[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_a0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"BamRandomAccessController::LocateIndex","");
    SetErrorString(this,&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    bVar3 = false;
  }
  else {
    bVar3 = OpenIndex(this,&local_40,reader);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool BamRandomAccessController::LocateIndex(BamReaderPrivate* reader,
                                            const BamIndex::IndexType& preferredType)
{
    // look up index filename, deferring to preferredType if possible
    assert(reader);
    const std::string& indexFilename =
        BamIndexFactory::FindIndexFilename(reader->Filename(), preferredType);

    // if no index file found (of any type)
    if (indexFilename.empty()) {
        const std::string message =
            std::string("could not find index file for:") + reader->Filename();
        SetErrorString("BamRandomAccessController::LocateIndex", message);
        return false;
    }

    // otherwise open & use index file that was found
    return OpenIndex(indexFilename, reader);
}